

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlEncodeEntities(uchar *out,int *outlen,uchar *in,int *inlen,int quoteChar)

{
  byte *pbVar1;
  byte bVar2;
  undefined4 in_EAX;
  int iVar3;
  uchar *puVar4;
  htmlEntityDesc *phVar5;
  size_t sVar6;
  uint uVar7;
  char *__s;
  uint uVar8;
  long lVar9;
  int iVar10;
  byte *pbVar11;
  int iVar12;
  undefined1 auVar13 [16];
  char nbuf [16];
  
  iVar12 = (int)out;
  auVar13._0_4_ = -(uint)(out == (uchar *)0x0);
  auVar13._4_4_ = -(uint)(outlen == (int *)0x0);
  auVar13._8_4_ = -(uint)(inlen == (int *)0x0);
  auVar13._12_4_ = -(uint)(in == (uchar *)0x0);
  iVar3 = movmskps(in_EAX,auVar13);
  if (iVar3 == 0) {
    puVar4 = out + *outlen;
    iVar3 = *inlen;
    pbVar11 = in;
    while (pbVar11 < in + iVar3) {
      bVar2 = *pbVar11;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        if (bVar2 < 0xc0) {
LAB_00148c4f:
          iVar10 = -2;
          goto LAB_00148c53;
        }
        uVar7 = (uint)bVar2;
        if (bVar2 < 0xe0) {
          uVar7 = uVar7 & 0x1f;
          uVar8 = 1;
        }
        else if (bVar2 < 0xf0) {
          uVar7 = uVar7 & 0xf;
          uVar8 = 2;
        }
        else {
          if (0xf7 < bVar2) goto LAB_00148c4f;
          uVar7 = uVar7 & 7;
          uVar8 = 3;
        }
      }
      else {
        uVar8 = 0;
      }
      pbVar1 = pbVar11 + 1;
      iVar10 = 0;
      if ((long)(in + iVar3) - (long)pbVar1 < (long)(ulong)uVar8) goto LAB_00148c53;
      for (lVar9 = 0; uVar8 != (uint)lVar9; lVar9 = lVar9 + 1) {
        if ((pbVar1[lVar9] & 0xc0) != 0x80) goto LAB_00148c4f;
        uVar7 = uVar7 << 6 | pbVar1[lVar9] & 0x3f;
      }
      if ((uVar7 < 0x80) && ((uVar7 & 0x7d) != 0x3c && (uVar7 != 0x26 && uVar7 != quoteChar))) {
        if (puVar4 <= out) goto LAB_00148c53;
        *out = (uchar)uVar7;
      }
      else {
        phVar5 = htmlEntityValueLookup(uVar7);
        if (phVar5 == (htmlEntityDesc *)0x0) {
          __s = nbuf;
          snprintf(__s,0x10,"#%u",(ulong)uVar7);
        }
        else {
          __s = phVar5->name;
        }
        sVar6 = strlen(__s);
        sVar6 = (size_t)(int)sVar6;
        iVar10 = 0;
        if (puVar4 < out + sVar6 + 2) goto LAB_00148c53;
        *out = '&';
        memcpy(out + 1,__s,sVar6);
        out = out + sVar6 + 1;
        *out = ';';
      }
      out = out + 1;
      pbVar11 = pbVar1 + uVar8;
    }
    iVar10 = 0;
LAB_00148c53:
    *outlen = (int)out - iVar12;
    *inlen = (int)pbVar11 - (int)in;
  }
  else {
    iVar10 = -1;
  }
  return iVar10;
}

Assistant:

int
htmlEncodeEntities(unsigned char* out, int *outlen,
		   const unsigned char* in, int *inlen, int quoteChar) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL))
        return(-1);
    outend = out + (*outlen);
    inend = in + (*inlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing)
	    break;

	while (trailing--) {
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if ((c < 0x80) && (c != (unsigned int) quoteChar) &&
	    (c != '&') && (c != '<') && (c != '>')) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];
	    int len;

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */
	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
		snprintf(nbuf, sizeof(nbuf), "#%u", c);
		cp = nbuf;
	    }
	    else
		cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len > outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}